

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

void google::protobuf::internal::TcParser::DestroyMapNode
               (NodeBase *node,MapAuxInfo map_info,UntypedMapBase *map)

{
  long *plVar1;
  undefined8 *puVar2;
  long *plVar3;
  uint uVar4;
  
  if ((map_info._0_4_ & 0x38) == 0x18) {
    if (node[1].next != node + 3) {
      operator_delete(node[1].next,(ulong)((long)&(node[3].next)->next + 1));
    }
  }
  uVar4 = (uint)((ulong)map_info >> 0xb) & 7;
  if (uVar4 == 4) {
    MessageLite::DestroyInstance
              ((MessageLite *)((long)&node->next + ((ulong)map_info >> 0x20 & 0xffff)));
  }
  else if (uVar4 == 3) {
    puVar2 = (undefined8 *)((long)&node->next + ((ulong)map_info >> 0x20 & 0xffff));
    plVar3 = puVar2 + 2;
    plVar1 = (long *)*puVar2;
    if (plVar1 != plVar3) {
      operator_delete(plVar1,*plVar3 + 1);
    }
  }
  UntypedMapBase::DeallocNode(map,node,(ulong)map_info >> 0x30);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TcParser::DestroyMapNode(NodeBase* node,
                                                MapAuxInfo map_info,
                                                UntypedMapBase& map) {
  if (map_info.key_type_card.cpp_type() == MapTypeCard::kString) {
    static_cast<std::string*>(node->GetVoidKey())->~basic_string();
  }
  if (map_info.value_type_card.cpp_type() == MapTypeCard::kString) {
    static_cast<std::string*>(node->GetVoidValue(map_info.node_size_info))
        ->~basic_string();
  } else if (map_info.value_type_card.cpp_type() == MapTypeCard::kMessage) {
    static_cast<MessageLite*>(node->GetVoidValue(map_info.node_size_info))
        ->DestroyInstance();
  }
  map.DeallocNode(node, map_info.node_size_info);
}